

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict4 index,
          aiNode *parent,aiNode *root_node,aiMatrix4x4 *absolute_transform)

{
  pointer paVar1;
  pointer paVar2;
  _Rb_tree_header *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  _Rb_tree_color _Var16;
  pointer paVar17;
  pointer paVar18;
  aiVector3D *paVar19;
  ShapeGeometry *this_00;
  pointer ppaVar20;
  pointer ppaVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  aiAnimMesh *paVar27;
  _Base_ptr p_Var28;
  aiFace *paVar29;
  aiMesh *out;
  pointer paVar30;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar31;
  Skin *pSVar32;
  int *piVar33;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar34
  ;
  aiVector3D *paVar35;
  ulong *puVar36;
  long lVar37;
  pointer *ppaVar38;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar39;
  ulong uVar40;
  void *__s;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar41;
  aiColor4D *paVar42;
  uint *puVar43;
  mapped_type *pmVar44;
  pointer *ppaVar45;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar46;
  pointer puVar47;
  aiAnimMesh **ppaVar48;
  undefined4 in_register_0000000c;
  aiFace *paVar49;
  pointer paVar50;
  Model *model_00;
  ulong uVar51;
  _Base_ptr p_Var52;
  ulong uVar53;
  uint uVar54;
  MeshGeometry *pMVar55;
  aiMesh *paVar56;
  _Base_ptr p_Var57;
  _Base_ptr p_Var58;
  ulong uVar59;
  uint uVar60;
  float fVar61;
  float fVar62;
  uint in_cursor;
  MeshGeometry *local_1a8;
  ulong local_1a0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_198;
  ulong local_190;
  undefined4 local_184;
  pointer local_180;
  pointer *local_178;
  pointer local_170;
  aiFace *local_168;
  aiAnimMesh *animMesh;
  undefined8 local_158;
  undefined8 uStack_150;
  pointer local_148;
  pointer *local_140;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  float local_118;
  float fStack_114;
  uint outIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  uint count;
  undefined4 uStack_a4;
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  aiNode *local_88;
  aiNode *local_80;
  Model *local_78;
  int *local_70;
  uint *local_68;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  
  local_180 = (pointer)CONCAT44(in_register_0000000c,index);
  local_80 = parent;
  local_78 = model;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,parent);
  paVar30 = (pointer)MeshGeometry::GetMaterialIndices(mesh);
  pvVar31 = MeshGeometry::GetVertices(mesh);
  local_158 = MeshGeometry::GetFaceIndexCounts(mesh);
  local_1a8 = mesh;
  if (this->doc->settings->readWeights == true) {
    pSVar32 = Geometry::DeformerSkin(&mesh->super_Geometry);
    local_184 = (undefined4)CONCAT71((int7)((ulong)pSVar32 >> 8),pSVar32 != (Skin *)0x0);
  }
  else {
    local_184 = 0;
  }
  piVar33 = *(int **)paVar30;
  local_148 = paVar30;
  if (piVar33 != *(int **)&paVar30->z) {
    puVar47 = (local_158->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar54 = 0;
    uVar60 = 0;
    do {
      if (*piVar33 == (int)local_180) {
        uVar54 = uVar54 + 1;
        uVar60 = uVar60 + *puVar47;
      }
      piVar33 = piVar33 + 1;
      puVar47 = puVar47 + 1;
    } while (piVar33 != *(int **)&paVar30->z);
    if (uVar54 != 0) {
      local_88 = root_node;
      if (uVar60 == 0) {
        __assert_fail("count_vertices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x50f,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                     );
      }
      reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var3 = &translateIndexMap._M_t._M_impl.super__Rb_tree_header;
      translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      if (((char)local_184 != '\0') ||
         (pvVar34 = Geometry::GetBlendShapes(&local_1a8->super_Geometry),
         (pvVar34->
         super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
         )._M_impl.super__Vector_impl_data._M_finish !=
         (pvVar34->
         super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
         )._M_impl.super__Vector_impl_data._M_start)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&reverseMapping,(ulong)uVar60);
      }
      out->mNumVertices = uVar60;
      paVar35 = (aiVector3D *)operator_new__((ulong)uVar60 * 0xc);
      memset(paVar35,0,(((ulong)uVar60 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      out->mVertices = paVar35;
      out->mNumFaces = uVar54;
      uVar40 = (ulong)uVar54;
      puVar36 = (ulong *)operator_new__(uVar40 * 0x10 + 8);
      pMVar55 = local_1a8;
      *puVar36 = uVar40;
      local_168 = (aiFace *)(puVar36 + 1);
      paVar49 = local_168;
      do {
        paVar49->mNumIndices = 0;
        paVar49->mIndices = (uint *)0x0;
        paVar49 = paVar49 + 1;
      } while (paVar49 != (aiFace *)(puVar36 + uVar40 * 2 + 1));
      out->mFaces = local_168;
      local_178 = (pointer *)MeshGeometry::GetNormals(local_1a8);
      lVar37 = (long)local_178[1] - (long)*local_178;
      if (lVar37 != 0) {
        paVar30 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar50 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if (lVar37 != (long)paVar50 - (long)paVar30) {
          __assert_fail("normals.size() == vertices.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0x523,
                        "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                       );
        }
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (lVar37 >> 2) * -0x5555555555555555;
        uVar40 = 0xffffffffffffffff;
        if (SUB168(auVar22 * ZEXT816(0xc),8) == 0) {
          uVar40 = SUB168(auVar22 * ZEXT816(0xc),0);
        }
        paVar35 = (aiVector3D *)operator_new__(uVar40);
        lVar37 = (long)paVar50 - (long)paVar30;
        if (lVar37 != 0) {
          memset(paVar35,0,((lVar37 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mNormals = paVar35;
      }
      ppaVar45 = local_178;
      ppaVar38 = (pointer *)MeshGeometry::GetTangents(pMVar55);
      local_198 = MeshGeometry::GetBinormals(pMVar55);
      tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar30 = *ppaVar38;
      local_140 = ppaVar38;
      if (ppaVar38[1] != paVar30) {
        paVar50 = ppaVar38[1];
        if ((local_198->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish ==
            (local_198->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start) {
          lVar37 = (long)ppaVar45[1] - (long)*ppaVar45;
          if (lVar37 == 0) {
            local_198 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
            goto LAB_005db3f8;
          }
          local_198 = &tempBinormals;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    (local_198,(lVar37 >> 2) * -0x5555555555555555);
          paVar30 = local_140[1];
          paVar50 = paVar30;
          if (paVar30 != *local_140) {
            uVar54 = 1;
            uVar40 = 0;
            paVar30 = *local_140;
            do {
              fVar61 = paVar30[uVar40].x;
              fVar62 = (*local_178)[uVar40].x;
              paVar50 = *local_178 + uVar40;
              uVar8 = paVar50->y;
              uVar14 = paVar50->z;
              uVar9 = paVar30[uVar40].y;
              uVar15 = paVar30[uVar40].z;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar40].x =
                   (float)uVar15 * (float)uVar8 - (float)uVar14 * (float)uVar9;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar40].y =
                   fVar61 * (float)uVar14 - fVar62 * (float)uVar15;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar40].z =
                   fVar62 * (float)uVar9 - fVar61 * (float)uVar8;
              uVar40 = (ulong)uVar54;
              paVar30 = *local_140;
              paVar50 = local_140[1];
              uVar53 = ((long)paVar50 - (long)paVar30 >> 2) * -0x5555555555555555;
              uVar54 = uVar54 + 1;
            } while (uVar40 <= uVar53 && uVar53 - uVar40 != 0);
          }
        }
        paVar17 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar18 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar37 = (long)paVar18 - (long)paVar17;
        if (((long)paVar50 - (long)paVar30 != lVar37) ||
           ((long)(local_198->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_198->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start != (long)paVar50 - (long)paVar30)) {
          __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0x53e,
                        "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                       );
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = (lVar37 >> 2) * -0x5555555555555555;
        uVar40 = 0xffffffffffffffff;
        if (SUB168(auVar23 * ZEXT816(0xc),8) == 0) {
          uVar40 = SUB168(auVar23 * ZEXT816(0xc),0);
        }
        paVar35 = (aiVector3D *)operator_new__(uVar40);
        lVar37 = (long)paVar18 - (long)paVar17;
        if (lVar37 != 0) {
          memset(paVar35,0,((lVar37 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mTangents = paVar35;
        paVar30 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar50 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = ((long)paVar50 - (long)paVar30 >> 2) * -0x5555555555555555;
        uVar40 = 0xffffffffffffffff;
        if (SUB168(auVar24 * ZEXT816(0xc),8) == 0) {
          uVar40 = SUB168(auVar24 * ZEXT816(0xc),0);
        }
        paVar35 = (aiVector3D *)operator_new__(uVar40);
        lVar37 = (long)paVar50 - (long)paVar30;
        if (lVar37 != 0) {
          memset(paVar35,0,((lVar37 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mBitangents = paVar35;
      }
LAB_005db3f8:
      local_1a0 = 0x2c;
      do {
        pvVar39 = MeshGeometry::GetTextureCoords(pMVar55,(int)local_1a0 - 0x2c);
        if ((pvVar39->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start ==
            (pvVar39->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          local_1a0 = (ulong)((int)local_1a0 - 0x2c);
          goto LAB_005db4db;
        }
        paVar30 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar50 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = ((long)paVar50 - (long)paVar30 >> 2) * -0x5555555555555555;
        uVar40 = SUB168(auVar25 * ZEXT816(0xc),0);
        if (SUB168(auVar25 * ZEXT816(0xc),8) != 0) {
          uVar40 = 0xffffffffffffffff;
        }
        __s = operator_new__(uVar40);
        lVar37 = (long)paVar50 - (long)paVar30;
        if (lVar37 != 0) {
          memset(__s,0,((lVar37 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)out + local_1a0 * 8 + -0xf0) = __s;
        *(undefined4 *)((long)out->mColors + local_1a0 * 4 + -0x30) = 2;
        local_1a0 = local_1a0 + 1;
        pMVar55 = local_1a8;
      } while (local_1a0 != 0x34);
      local_1a0 = 8;
LAB_005db4db:
      pMVar55 = local_1a8;
      local_190 = 0;
      do {
        pvVar41 = MeshGeometry::GetVertexColors(pMVar55,(uint)local_190);
        if ((pvVar41->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start ==
            (pvVar41->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_005db572;
        paVar30 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar50 = (pvVar31->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar37 = (long)paVar50 - (long)paVar30 >> 2;
        uVar40 = lVar37 * -0x5555555555555550;
        paVar42 = (aiColor4D *)
                  operator_new__(-(ulong)((ulong)(lVar37 * -0x5555555555555555) >> 0x3c != 0) |
                                 uVar40);
        if (paVar50 != paVar30) {
          memset(paVar42,0,uVar40);
        }
        out->mColors[local_190] = paVar42;
        local_190 = local_190 + 1;
      } while (local_190 != 8);
      local_190 = 8;
LAB_005db572:
      in_cursor = 0;
      piVar33 = *(int **)local_148;
      local_70 = *(int **)&local_148->z;
      if (piVar33 != local_70) {
        puVar43 = (local_158->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar53 = local_1a0 & 0xffffffff;
        uVar40 = local_190 & 0xffffffff;
        local_158 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        do {
          paVar49 = local_168;
          uVar54 = *puVar43;
          local_68 = puVar43;
          if (*piVar33 == (int)local_180) {
            local_168->mNumIndices = uVar54;
            puVar43 = (uint *)operator_new__((long)(ulong)uVar54 * 4);
            paVar29 = paVar49 + 1;
            paVar49->mIndices = puVar43;
            if (uVar54 - 1 < 3) {
              out->mPrimitiveTypes =
                   out->mPrimitiveTypes | *(uint *)(&DAT_006eea90 + (ulong)(uVar54 - 1) * 4);
            }
            else {
              out->mPrimitiveTypes = out->mPrimitiveTypes | 8;
              if (uVar54 == 0) goto LAB_005db7fc;
            }
            paVar30 = (pointer)0x0;
            local_170 = (pointer)(ulong)uVar54;
            do {
              local_168->mIndices[(long)paVar30] = (uint)local_158;
              uVar51 = (ulong)local_158 & 0xffffffff;
              local_148 = paVar30;
              if (reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar51] = in_cursor;
                pmVar44 = std::
                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          ::operator[](&translateIndexMap,&in_cursor);
                *pmVar44 = (mapped_type)local_158;
              }
              uVar59 = (ulong)in_cursor;
              paVar30 = (pvVar31->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              paVar35 = out->mVertices;
              paVar35[uVar51].z = paVar30[uVar59].z;
              paVar30 = paVar30 + uVar59;
              fVar61 = paVar30->y;
              paVar35 = paVar35 + uVar51;
              paVar35->x = paVar30->x;
              paVar35->y = fVar61;
              paVar35 = out->mNormals;
              if (paVar35 != (aiVector3D *)0x0) {
                paVar30 = *local_178;
                paVar35[uVar51].z = paVar30[uVar59].z;
                paVar30 = paVar30 + uVar59;
                fVar61 = paVar30->y;
                paVar35[uVar51].x = paVar30->x;
                paVar35[uVar51].y = fVar61;
              }
              paVar35 = out->mTangents;
              if (paVar35 != (aiVector3D *)0x0) {
                paVar30 = *local_140;
                paVar35[uVar51].z = paVar30[uVar59].z;
                paVar30 = paVar30 + uVar59;
                fVar61 = paVar30->y;
                paVar35[uVar51].x = paVar30->x;
                paVar35[uVar51].y = fVar61;
                paVar30 = (local_198->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar35 = out->mBitangents;
                paVar35[uVar51].z = paVar30[uVar59].z;
                paVar30 = paVar30 + uVar59;
                fVar61 = paVar30->y;
                paVar35 = paVar35 + uVar51;
                paVar35->x = paVar30->x;
                paVar35->y = fVar61;
              }
              if ((float)local_1a0 != 0.0) {
                uVar59 = 0;
                do {
                  pvVar39 = MeshGeometry::GetTextureCoords(local_1a8,(uint)uVar59);
                  paVar19 = out->mTextureCoords[uVar59];
                  paVar1 = (pvVar39->
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + in_cursor;
                  fVar61 = paVar1->y;
                  paVar35 = paVar19 + uVar51;
                  paVar35->x = paVar1->x;
                  paVar35->y = fVar61;
                  paVar19[uVar51].z = 0.0;
                  uVar59 = uVar59 + 1;
                } while (uVar53 != uVar59);
              }
              if ((int)local_190 != 0) {
                uVar59 = 0;
                do {
                  pvVar41 = MeshGeometry::GetVertexColors(local_1a8,(uint)uVar59);
                  paVar2 = (pvVar41->
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)
                           ._M_impl.super__Vector_impl_data._M_start + in_cursor;
                  fVar61 = paVar2->g;
                  fVar62 = paVar2->b;
                  fVar26 = paVar2->a;
                  paVar42 = out->mColors[uVar59] + uVar51;
                  paVar42->r = paVar2->r;
                  paVar42->g = fVar61;
                  paVar42->b = fVar62;
                  paVar42->a = fVar26;
                  uVar59 = uVar59 + 1;
                } while (uVar40 != uVar59);
              }
              paVar30 = (pointer)((long)&(((_Vector_base<int,_std::allocator<int>_> *)&local_148->x)
                                         ->_M_impl).super__Vector_impl_data._M_start + 1);
              local_158 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (ulong)((int)local_158 + 1);
              in_cursor = in_cursor + 1;
              pMVar55 = local_1a8;
            } while (paVar30 != local_170);
          }
          else {
            in_cursor = in_cursor + uVar54;
            paVar29 = local_168;
          }
LAB_005db7fc:
          local_168 = paVar29;
          piVar33 = piVar33 + 1;
          puVar43 = local_68 + 1;
        } while (piVar33 != local_70);
      }
      paVar56 = out;
      ConvertMaterialForMesh(this,out,local_78,pMVar55,(value_type_conflict4)local_180);
      if ((char)local_184 != '\0') {
        paVar56 = out;
        ConvertWeights(this,out,model_00,pMVar55,absolute_transform,local_80,local_88,
                       (uint)local_180,&reverseMapping);
      }
      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar34 = Geometry::GetBlendShapes(&pMVar55->super_Geometry);
      ppaVar45 = (pointer *)
                 (pvVar34->
                 super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_180 = (pvVar34->
                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)ppaVar45 != local_180) {
        do {
          ppaVar38 = *(pointer **)(*ppaVar45 + 6);
          local_198 = *(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> **)
                       &(*ppaVar45)[6].z;
          local_140 = ppaVar45;
          if ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppaVar38 !=
              local_198) {
            do {
              local_170 = *ppaVar38;
              local_178 = ppaVar38;
              if (*(pointer *)&local_170[9].y != *(pointer *)&local_170[8].z) {
                uVar40 = 0;
                do {
                  animMesh = aiCreateAnimMesh(out);
                  if ((ulong)((long)*(pointer *)&local_170[9].y - (long)*(pointer *)&local_170[8].z
                             >> 3) <= uVar40) {
LAB_005dbf02:
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar40);
                    goto LAB_005dbf13;
                  }
                  this_00 = *(ShapeGeometry **)(*(pointer *)&local_170[8].z + uVar40 * 2);
                  local_168 = (aiFace *)ShapeGeometry::GetVertices(this_00);
                  pvVar31 = ShapeGeometry::GetNormals(this_00);
                  pvVar46 = ShapeGeometry::GetIndices(this_00);
                  paVar27 = animMesh;
                  local_190 = uVar40;
                  FixAnimMeshName((string *)&count,(FBXConverter *)paVar56,
                                  &(this_00->super_Geometry).super_Object.name);
                  uVar40 = local_a0;
                  if (local_a0 < 0x400) {
                    (paVar27->mName).length = (ai_uint32)local_a0;
                    memcpy((paVar27->mName).data,(void *)CONCAT44(uStack_a4,count),local_a0);
                    (paVar27->mName).data[uVar40] = '\0';
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_a4,count) != &local_98) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(uStack_a4,count),local_98._M_allocated_capacity + 1)
                    ;
                  }
                  puVar47 = (pvVar46->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  if ((pvVar46->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish != puVar47) {
                    uVar53 = 0;
                    do {
                      uVar40 = local_190;
                      lVar37 = *(long *)local_168;
                      uVar51 = ((long)local_168->mIndices - lVar37 >> 2) * -0x5555555555555555;
                      if (uVar51 < uVar53 || uVar51 - uVar53 == 0) {
LAB_005dbef1:
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar53);
                        goto LAB_005dbf02;
                      }
                      paVar30 = (pvVar31->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      uVar51 = ((long)(pvVar31->
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >>
                               2) * -0x5555555555555555;
                      if (uVar51 < uVar53 || uVar51 - uVar53 == 0) {
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar53);
                        goto LAB_005dbef1;
                      }
                      local_158 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                   (lVar37 + uVar53 * 0xc);
                      uStack_150 = 0;
                      local_148 = (pointer)CONCAT44(local_148._4_4_,
                                                    *(undefined4 *)(lVar37 + 8 + uVar53 * 0xc));
                      uVar4 = paVar30[uVar53].x;
                      uVar10 = paVar30[uVar53].y;
                      local_1a0 = CONCAT44(local_1a0._4_4_,paVar30[uVar53].z);
                      count = 0;
                      puVar43 = MeshGeometry::ToOutputVertexIndex(pMVar55,puVar47[uVar53],&count);
                      if (count != 0) {
                        uVar40 = 0;
                        do {
                          outIndex = puVar43[uVar40];
                          p_Var28 = translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_parent;
                          p_Var58 = &p_Var3->_M_header;
                          if (translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent != (_Base_ptr)0x0) {
                            do {
                              p_Var57 = p_Var58;
                              p_Var52 = p_Var28;
                              _Var16 = p_Var52[1]._M_color;
                              p_Var58 = p_Var52;
                              if (_Var16 < outIndex) {
                                p_Var58 = p_Var57;
                              }
                              p_Var28 = (&p_Var52->_M_left)[_Var16 < outIndex];
                            } while ((&p_Var52->_M_left)[_Var16 < outIndex] != (_Base_ptr)0x0);
                            if ((_Rb_tree_header *)p_Var58 != p_Var3) {
                              if (_Var16 < outIndex) {
                                p_Var52 = p_Var57;
                              }
                              if (p_Var52[1]._M_color <= outIndex) {
                                pmVar44 = std::
                                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                          ::operator[](&translateIndexMap,&outIndex);
                                uVar54 = *pmVar44;
                                paVar35 = animMesh->mVertices;
                                uVar5 = paVar35[uVar54].x;
                                uVar11 = paVar35[uVar54].y;
                                paVar35[uVar54].x = (float)uVar5 + (float)local_158;
                                paVar35[uVar54].y = (float)uVar11 + local_158._4_4_;
                                paVar35[uVar54].z = paVar35[uVar54].z + local_148._0_4_;
                                paVar35 = animMesh->mNormals;
                                if (paVar35 != (aiVector3D *)0x0) {
                                  uVar6 = paVar35[uVar54].x;
                                  uVar12 = paVar35[uVar54].y;
                                  paVar35[uVar54].x = (float)uVar6 + (float)uVar4;
                                  paVar35[uVar54].y = (float)uVar12 + (float)uVar10;
                                  paVar35[uVar54].z = paVar35[uVar54].z + (float)local_1a0;
                                  paVar35 = animMesh->mNormals;
                                  uVar7 = paVar35[uVar54].x;
                                  uVar13 = paVar35[uVar54].y;
                                  fVar61 = paVar35[uVar54].z;
                                  fVar62 = SQRT(fVar61 * fVar61 +
                                                (float)uVar7 * (float)uVar7 +
                                                (float)uVar13 * (float)uVar13);
                                  if (0.0 < fVar62) {
                                    paVar35 = paVar35 + uVar54;
                                    fVar62 = 1.0 / fVar62;
                                    paVar35->x = (float)uVar7 * fVar62;
                                    paVar35->y = (float)uVar13 * fVar62;
                                    paVar35->z = fVar61 * fVar62;
                                  }
                                }
                              }
                            }
                          }
                          uVar40 = uVar40 + 1;
                        } while (uVar40 < count);
                      }
                      uVar53 = uVar53 + 1;
                      puVar47 = (pvVar46->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      pMVar55 = local_1a8;
                    } while (uVar53 < (ulong)((long)(pvVar46->
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)puVar47 >> 2));
                  }
                  uVar40 = local_190;
                  fVar61 = 1.0;
                  if (8 < (ulong)((long)*(pointer *)&local_170[9].y -
                                 (long)*(pointer *)&local_170[8].z)) {
                    fVar61 = *(float *)&(((_Vector_base<int,_std::allocator<int>_> *)&local_170[6].x
                                         )->_M_impl).super__Vector_impl_data._M_start / 100.0;
                  }
                  animMesh->mWeight = fVar61;
                  paVar56 = (aiMesh *)
                            animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
                    _M_realloc_insert<aiAnimMesh*const&>
                              ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&animMeshes,
                               (iterator)
                               animMeshes.
                               super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&animMesh);
                  }
                  else {
                    *animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish = animMesh;
                    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  uVar40 = uVar40 + 1;
                } while (uVar40 < (ulong)((long)*(pointer *)&local_170[9].y -
                                          (long)*(pointer *)&local_170[8].z >> 3));
              }
              ppaVar38 = local_178 + 1;
            } while ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppaVar38 !=
                     local_198);
          }
          ppaVar45 = local_140 + 1;
        } while ((pointer)ppaVar45 != local_180);
      }
      if ((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        uVar40 = (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        out->mNumAnimMeshes = (uint)uVar40;
        ppaVar48 = (aiAnimMesh **)
                   operator_new__(-(ulong)(uVar40 >> 0x3d != 0) |
                                  (long)animMeshes.
                                        super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)animMeshes.
                                        super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
        out->mAnimMeshes = ppaVar48;
        uVar53 = 0;
        do {
          if ((ulong)((long)animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar53) goto LAB_005dbf13;
          out->mAnimMeshes[uVar53] =
               animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar53];
          uVar53 = uVar53 + 1;
        } while (uVar40 + (uVar40 == 0) != uVar53);
      }
      ppaVar20 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar21 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)animMeshes.
                              super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)animMeshes.
                              super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tempBinormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)tempBinormals.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)tempBinormals.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&translateIndexMap._M_t);
      if (reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(reverseMapping.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)reverseMapping.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)reverseMapping.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return (int)((ulong)((long)ppaVar21 - (long)ppaVar20) >> 3) - 1;
    }
  }
LAB_005dbf21:
  __assert_fail("count_faces",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0x50e,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
               );
LAB_005dbf13:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_005dbf21;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &mesh, const Model &model,
                                                            MatIndexArray::value_type index,
                                                            aiNode *parent, aiNode *root_node,
                                                            const aiMatrix4x4 &absolute_transform)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, parent);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != nullptr;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = nullptr;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, absolute_transform, parent, root_node, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }